

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O0

int getoken(expr *expr,ex_ex *eptr)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ushort **ppuVar4;
  char *pcVar5;
  t_float *ptVar6;
  anon_union_8_5_735de1bb_for_ex_cont local_48;
  ex_ex ex;
  long i;
  char *p;
  ex_ex *eptr_local;
  expr *expr_local;
  
  if (expr->exp_str == (char *)0x0) {
    post("expr: getoken: expression string not set\n");
  }
  else {
    while (*expr->exp_str != '\0') {
      if (*expr->exp_str == ';') {
        expr->exp_str = expr->exp_str + 1;
        eptr->ex_type = 0;
        (eptr->ex_cont).v_int = 0;
        return 0;
      }
      eptr->ex_type = 3;
      pcVar5 = expr->exp_str;
      expr->exp_str = pcVar5 + 1;
      switch(*pcVar5) {
      case '\t':
      case ' ':
      case '\\':
        break;
      default:
        i = (long)(expr->exp_str + -1);
        expr->exp_str = (char *)i;
        ex.ex_end = (ex_ex *)0x0;
        while( true ) {
          bVar2 = true;
          if (((*(char *)i != '_') && ((*(char *)i < 'a' || (bVar2 = true, 'z' < *(char *)i)))) &&
             (((*(char *)i < 'A' || (bVar2 = true, 'Z' < *(char *)i)) &&
              (bVar2 = false, '/' < *(char *)i)))) {
            bVar2 = *(char *)i < ':';
          }
          if (!bVar2) break;
          i = i + 1;
          ex.ex_end = (ex_ex *)((long)&(ex.ex_end)->ex_cont + 1);
        }
        if (ex.ex_end != (ex_ex *)0x0) {
          ptVar6 = (t_float *)malloc((size_t)((long)&(ex.ex_end)->ex_cont + 1));
          (eptr->ex_cont).v_vec = ptVar6;
          strncpy((eptr->ex_cont).ptr,expr->exp_str,(long)(int)ex.ex_end);
          *(undefined1 *)((long)&(ex.ex_end)->ex_cont + (long)(eptr->ex_cont).v_vec) = 0;
          expr->exp_str = (char *)i;
          eptr->ex_type = 4;
          return 0;
        }
        post("expr: syntax error: %s\n",expr->exp_str);
        return 1;
      case '!':
        if (*expr->exp_str == '=') {
          (eptr->ex_cont).v_vec = (t_float *)0x90008;
          expr->exp_str = expr->exp_str + 1;
          return 0;
        }
        (eptr->ex_cont).v_vec = (t_float *)0xe0017;
        return 0;
      case '\"':
        memset(&local_48,0,0x18);
        pcVar5 = expr->exp_str;
        if ((*expr->exp_str == '\0') || (*expr->exp_str == '\"')) {
          expr->exp_str = expr->exp_str + -1;
          post("expr: syntax error: empty symbol: %s\n");
          return 1;
        }
        iVar3 = getoken(expr,(ex_ex *)&local_48);
        if (iVar3 != 0) {
          return 1;
        }
        if (ex.ex_cont.v_int == 4) {
          iVar3 = ex_getsym(local_48.ptr,(fts_symbol_t *)eptr);
          if (iVar3 != 0) {
            post("expr: syntax error: getoken: problms with ex_getsym\n");
            return 1;
          }
          eptr->ex_type = 7;
        }
        else {
          if (ex.ex_cont.v_int != 0xd) {
            post("expr: syntax error: bad symbol name: %s\n",pcVar5);
            return 1;
          }
          (eptr->ex_cont).ptr = (char *)local_48;
          eptr->ex_type = 0xd;
          eptr->ex_end = (ex_ex *)ex.ex_type;
          eptr->ex_type = 8;
        }
        pcVar5 = expr->exp_str;
        expr->exp_str = pcVar5 + 1;
        if (*pcVar5 == '\"') {
          return 0;
        }
        post("expr: syntax error: missing \'\"\'\n");
        return 1;
      case '$':
        pcVar5 = expr->exp_str;
        expr->exp_str = pcVar5 + 1;
        switch(*pcVar5) {
        default:
          post("expr: syntax error: %s\n",expr->exp_str + -2);
          return 1;
        case 'F':
        case 'f':
          eptr->ex_type = 0xc;
          break;
        case 'I':
        case 'i':
          eptr->ex_type = 0xb;
          break;
        case 'S':
        case 's':
          eptr->ex_type = 0xd;
          break;
        case 'V':
        case 'v':
          if ((expr->exp_flags & 7U | 2) != 2) {
            post("$v? works only for expr~");
            post("expr: syntax error: %s\n",expr->exp_str + -2);
            return 1;
          }
          eptr->ex_type = 0xe;
          break;
        case 'X':
        case 'x':
          if ((expr->exp_flags & 7U | 4) != 4) {
            post("$x? works only for fexpr~");
            post("expr: syntax error: %s\n",expr->exp_str + -2);
            return 1;
          }
          eptr->ex_type = 0x12;
          ppuVar4 = __ctype_b_loc();
          if (((*ppuVar4)[(int)*expr->exp_str] & 0x800) == 0) {
            (eptr->ex_cont).v_int = 0;
            expr->exp_var[(eptr->ex_cont).v_int].ex_type = eptr->ex_type;
            return 0;
          }
          break;
        case 'Y':
        case 'y':
          if ((expr->exp_flags & 7U | 4) == 4) {
            eptr->ex_type = 0x10;
            ppuVar4 = __ctype_b_loc();
            if (((*ppuVar4)[(int)*expr->exp_str] & 0x800) == 0) {
              (eptr->ex_cont).v_int = 0;
              expr->exp_var[(eptr->ex_cont).v_int].ex_type = eptr->ex_type;
              return 0;
            }
            break;
          }
          post("$y works only for fexpr~");
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
          pcVar5 = expr->exp_str;
          expr->exp_str = pcVar5 + -1;
          pcVar5 = atoif(pcVar5 + -1,(long *)eptr,(long *)&ex.ex_end);
          if (pcVar5 == (char *)0x0) {
            return 1;
          }
          if (ex.ex_end == (ex_ex *)&DAT_00000001) {
            expr->exp_str = pcVar5;
            eptr->ex_type = 1;
            (eptr->ex_cont).v_int = 0;
            return 0;
          }
          post("expr: syntax error: %s\n",expr->exp_str);
          return 1;
        }
        pcVar5 = atoif(expr->exp_str,(long *)eptr,(long *)&ex.ex_end);
        if (pcVar5 == (char *)0x0) {
          post("expr: syntax error: %s\n",expr->exp_str + -2);
          return 1;
        }
        if (ex.ex_end != (ex_ex *)&DAT_00000001) {
          post("expr: syntax error: %s\n",expr->exp_str);
          return 1;
        }
        if (((eptr->ex_cont).v_int == 0) ||
           (lVar1 = (eptr->ex_cont).v_int, (eptr->ex_cont).v_vec = (t_float *)(lVar1 + -1),
           100 < lVar1)) {
          post("expr: syntax error: inlet or outlet out of range: %s\n",expr->exp_str);
          return 1;
        }
        if ((((eptr->ex_cont).v_int == 0) &&
            (((expr->exp_flags & 7U | 4) == 4 || ((expr->exp_flags & 7U | 2) == 2)))) &&
           ((eptr->ex_type == 0xb || ((eptr->ex_type == 0xc || (eptr->ex_type == 0xd)))))) {
          post("first inlet of expr~/fexpr~ can only be a vector");
          return 1;
        }
        if (eptr->ex_type != 0x10) {
          if (expr->exp_var[(eptr->ex_cont).v_int].ex_type == 0) {
            expr->exp_var[(eptr->ex_cont).v_int].ex_type = eptr->ex_type;
          }
          else if (expr->exp_var[(eptr->ex_cont).v_int].ex_type != eptr->ex_type) {
            post("expr: syntax error: inlets can only have one type: %s\n",expr->exp_str);
            return 1;
          }
        }
        expr->exp_str = pcVar5;
        return 0;
      case '%':
        (eptr->ex_cont).v_vec = (t_float *)0xd0012;
        return 0;
      case '&':
        if (*expr->exp_str == '&') {
          expr->exp_str = expr->exp_str + 1;
          (eptr->ex_cont).v_vec = (t_float *)0x50004;
          return 0;
        }
        (eptr->ex_cont).v_vec = (t_float *)0x80007;
        return 0;
      case '(':
        (eptr->ex_cont).v_vec = (t_float *)0xf001b;
        return 0;
      case ')':
        (eptr->ex_cont).v_vec = (t_float *)0xf001a;
        return 0;
      case '*':
        (eptr->ex_cont).v_vec = (t_float *)0xd0014;
        return 0;
      case '+':
        (eptr->ex_cont).v_vec = (t_float *)0xc0011;
        return 0;
      case ',':
        (eptr->ex_cont).v_vec = (t_float *)0x20002;
        return 0;
      case '-':
        (eptr->ex_cont).v_vec = (t_float *)0xc0010;
        return 0;
      case '.':
      case '0':
      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        pcVar5 = expr->exp_str;
        expr->exp_str = pcVar5 + -1;
        pcVar5 = atoif(pcVar5 + -1,(long *)eptr,&eptr->ex_type);
        if (pcVar5 != (char *)0x0) {
          expr->exp_str = pcVar5;
          return 0;
        }
        return 1;
      case '/':
        (eptr->ex_cont).v_vec = (t_float *)0xd0013;
        return 0;
      case ';':
        post("expr: syntax error: \';\' not implemented\n");
        return 1;
      case '<':
        if (*expr->exp_str == '<') {
          (eptr->ex_cont).v_vec = (t_float *)0xb000f;
          expr->exp_str = expr->exp_str + 1;
          return 0;
        }
        if (*expr->exp_str != '=') {
          (eptr->ex_cont).v_vec = (t_float *)0xa000d;
          return 0;
        }
        (eptr->ex_cont).v_vec = (t_float *)0xa000c;
        expr->exp_str = expr->exp_str + 1;
        return 0;
      case '=':
        if (*expr->exp_str != '=') {
          (eptr->ex_cont).v_vec = (t_float *)0x3001c;
          return 0;
        }
        expr->exp_str = expr->exp_str + 1;
        (eptr->ex_cont).v_vec = (t_float *)0x90009;
        return 0;
      case '>':
        if (*expr->exp_str == '=') {
          (eptr->ex_cont).v_vec = (t_float *)0xa000a;
          expr->exp_str = expr->exp_str + 1;
          return 0;
        }
        if (*expr->exp_str == '>') {
          (eptr->ex_cont).v_vec = (t_float *)0xb000e;
          expr->exp_str = expr->exp_str + 1;
          return 0;
        }
        (eptr->ex_cont).v_vec = (t_float *)0xa000b;
        return 0;
      case '[':
        (eptr->ex_cont).v_vec = (t_float *)0xf0019;
        return 0;
      case ']':
        (eptr->ex_cont).v_vec = (t_float *)0xf0018;
        return 0;
      case '^':
        (eptr->ex_cont).v_vec = (t_float *)0x70006;
        return 0;
      case '|':
        if (*expr->exp_str == '|') {
          expr->exp_str = expr->exp_str + 1;
          (eptr->ex_cont).v_vec = (t_float *)0x40003;
          return 0;
        }
        (eptr->ex_cont).v_vec = (t_float *)0x60005;
        return 0;
      case '~':
        (eptr->ex_cont).v_vec = (t_float *)0xe0016;
        return 0;
      }
    }
    eptr->ex_type = 0;
    (eptr->ex_cont).v_int = 0;
  }
  return 0;
}

Assistant:

int
getoken(struct expr *expr, struct ex_ex *eptr)
{
        char *p;
        long i;


        if (!expr->exp_str) {
                post("expr: getoken: expression string not set\n");
                return (0);
        }
retry:
        if (!*expr->exp_str) {
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        if (*expr->exp_str == ';') {
                expr->exp_str++;
                eptr->ex_type = 0;
                eptr->ex_int = 0;
                return (0);
        }
        eptr->ex_type = ET_OP;
        switch (*expr->exp_str++) {
        case '\\':
        case ' ':
        case '\t':
                goto retry;
        case ';':
                post("expr: syntax error: ';' not implemented\n");
                return (1);
        case ',':
                eptr->ex_op = OP_COMMA;
                break;
        case '(':
                eptr->ex_op = OP_LP;
                break;
        case ')':
                eptr->ex_op = OP_RP;
                break;
        case ']':
                eptr->ex_op = OP_RB;
                break;
        case '~':
                eptr->ex_op = OP_NEG;
                break;
                /* we will take care of unary minus later */
        case '*':
                eptr->ex_op = OP_MUL;
                break;
        case '/':
                eptr->ex_op = OP_DIV;
                break;
        case '%':
                eptr->ex_op = OP_MOD;
                break;
        case '+':
                eptr->ex_op = OP_ADD;
                break;
        case '-':
                eptr->ex_op = OP_SUB;
                break;
        case '^':
                eptr->ex_op = OP_XOR;
                break;
        case '[':
                eptr->ex_op = OP_LB;
                break;
        case '!':
                if (*expr->exp_str == '=') {
                        eptr->ex_op = OP_NE;
                        expr->exp_str++;
                } else
                        eptr->ex_op = OP_NOT;
                break;
        case '<':
                switch (*expr->exp_str) {
                case '<':
                        eptr->ex_op = OP_SL;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_LE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_LT;
                        break;
                }
                break;
        case '>':
                switch (*expr->exp_str) {
                case '>':
                        eptr->ex_op = OP_SR;
                        expr->exp_str++;
                        break;
                case '=':
                        eptr->ex_op = OP_GE;
                        expr->exp_str++;
                        break;
                default:
                        eptr->ex_op = OP_GT;
                        break;
                }
                break;
        case '=':
                if (*expr->exp_str != '=')
                        eptr->ex_op = OP_STORE;
                else {
                        expr->exp_str++;
                        eptr->ex_op = OP_EQ;
                }
                break;

        case '&':
                if (*expr->exp_str == '&') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LAND;
                } else
                        eptr->ex_op = OP_AND;
                break;

        case '|':
                if (*expr->exp_str == '|') {
                        expr->exp_str++;
                        eptr->ex_op = OP_LOR;
                } else
                        eptr->ex_op = OP_OR;
                break;
        case '$':
                switch (*expr->exp_str++) {
                case 'I':
                case 'i':
                        eptr->ex_type = ET_II;
                        break;
                case 'F':
                case 'f':
                        eptr->ex_type = ET_FI;
                        break;
                case 'S':
                case 's':
                        eptr->ex_type = ET_SI;
                        break;
                case 'V':
                case 'v':
                        if (IS_EXPR_TILDE(expr)) {
                                eptr->ex_type = ET_VI;
                                break;
                        }
                        post("$v? works only for expr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'X':
                case 'x':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_XI;
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $x[] is a shorhand for $x1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$x? works only for fexpr~");
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                case 'y':
                case 'Y':
                        if (IS_FEXPR_TILDE(expr)) {
                                eptr->ex_type = ET_YO;
                                /*$y takes no number */
                                if (isdigit((int)(*expr->exp_str)))
                                        break;
                                /* for $y[] is a shorhand for $y1[] */
                                /* eptr->ex_int = 0; */
                                                                eptr->ex_op = 0;
                                                                expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                                goto noinletnum;
                        }
                        post("$y works only for fexpr~");
                                /* falls through */
                                /*
                                 * allow $# for abstraction argument substitution
                                 *  $1+1 is translated to 0+1 and in abstraction substitution
                                 *  the value is replaced with the new string
                                 */
                                case '0':
                                case '1':
                                case '2':
                                case '3':
                                case '4':
                                case '5':
                                case '6':
                                case '7':
                                case '8':
                                case '9':
                                        p = atoif(--expr->exp_str, &eptr->ex_op, &i);
                        if (!p)
                        return (1);
                                        if (i != ET_INT) {
                                                post("expr: syntax error: %s\n", expr->exp_str);
                                                return (1);
                                        }
                        expr->exp_str = p;
                                        eptr->ex_type = ET_INT;
                                        eptr->ex_int = 0;
                        return (0);
                default:
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                p = atoif(expr->exp_str, &eptr->ex_op, &i);
                if (!p) {
                        post("expr: syntax error: %s\n", &expr->exp_str[-2]);
                        return (1);
                }
                if (i != ET_INT) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                /*
                 * make the user inlets one based rather than zero based
                 * therefore we decrement the number that user has supplied
                 */
                if (!eptr->ex_op || (eptr->ex_op)-- > MAX_VARS) {
                 post("expr: syntax error: inlet or outlet out of range: %s\n",
                                                             expr->exp_str);
                        return (1);
                }

                /*
                 * until we can change the input type of inlets on
                 * the fly (at pd_new()
                 * time) the first input to expr~ is always a vector
                 * and $f1 or $i1 is
                 * illegal for fexpr~
                 */
                if (eptr->ex_op == 0 &&
                   (IS_FEXPR_TILDE(expr) ||  IS_EXPR_TILDE(expr)) &&
                   (eptr->ex_type==ET_II || eptr->ex_type==ET_FI ||
                                                        eptr->ex_type==ET_SI)) {
                       post("first inlet of expr~/fexpr~ can only be a vector");
                       return (1);
                }
                /* record the inlet or outlet type and check for consistency */
                if (eptr->ex_type == ET_YO ) {
                        /* it is an outlet  for fexpr~*/
                        /* no need to do anything */
                        ;
                } else if (!expr->exp_var[eptr->ex_op].ex_type)
                        expr->exp_var[eptr->ex_op].ex_type = eptr->ex_type;
                else if (expr->exp_var[eptr->ex_op].ex_type != eptr->ex_type) {
                        post("expr: syntax error: inlets can only have one type: %s\n", expr->exp_str);
                        return (1);
                }
                expr->exp_str = p;
noinletnum:
                break;
        case '"':
                {
                        struct ex_ex ex = { 0 };

                        p = expr->exp_str;
                        if (!*expr->exp_str || *expr->exp_str == '"') {
                                post("expr: syntax error: empty symbol: %s\n", --expr->exp_str);
                                return (1);
                        }
                        if (getoken(expr, &ex))
                                return (1);
                        switch (ex.ex_type) {
                        case ET_STR:
                                if (ex_getsym(ex.ex_ptr, (t_symbol **)&(eptr->ex_ptr))) {
                                        post("expr: syntax error: getoken: problms with ex_getsym\n");
                                        return (1);
                                }
                                eptr->ex_type = ET_SYM;
                                break;
                        case ET_SI:
                                *eptr = ex;
                                eptr->ex_type = ET_VSYM;
                                break;
                        default:
                                post("expr: syntax error: bad symbol name: %s\n", p);
                                return (1);
                        }
                        if (*expr->exp_str++ != '"') {
                                post("expr: syntax error: missing '\"'\n");
                                return (1);
                        }
                        break;
                }
        case '.':
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
        case '8':
        case '9':
                p = atoif(--expr->exp_str, &eptr->ex_int, &eptr->ex_type);
                if (!p)
                        return (1);
                expr->exp_str = p;
                break;

        default:
                /*
                 * has to be a string, it should either be a
                 * function or a table
                 */
                p = --expr->exp_str;
                for (i = 0; name_ok(*p); i++)
                        p++;
                if (!i) {
                        post("expr: syntax error: %s\n", expr->exp_str);
                        return (1);
                }
                eptr->ex_ptr = (char *)fts_malloc(i + 1);
                strncpy(eptr->ex_ptr, expr->exp_str, (int) i);
                (eptr->ex_ptr)[i] = 0;
                expr->exp_str = p;
                /*
                 * we mark this as a string and later we will change this
                 * to either a function or a table
                 */
                eptr->ex_type = ET_STR;
                break;
        }
        return (0);
}